

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall duckdb::Linenoise::EditMoveWordRight(Linenoise *this)

{
  size_t cpos;
  size_t len;
  char *s;
  
  cpos = this->pos;
  len = this->len;
  if (cpos == len) {
    return;
  }
  s = this->buf;
  do {
    cpos = Utf8Proc::NextGraphemeCluster(s,len,cpos);
    this->pos = cpos;
    len = this->len;
    if (cpos == len) break;
    s = this->buf;
  } while ((0xf5 < (byte)(s[cpos] - 0x3aU)) || (0xe5 < (byte)((s[cpos] & 0xdfU) + 0xa5)));
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditMoveWordRight() {
	if (pos == len) {
		return;
	}
	do {
		pos = NextChar();
	} while (pos != len && !IsWordBoundary(buf[pos]));
	RefreshLine();
}